

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O2

void __thiscall
dg::DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFS>::DGLLVMPointerAnalysisImpl
          (DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFS> *this,PointerGraph *PS,
          LLVMPointerGraphBuilder *b,LLVMPointerAnalysisOptions *opts)

{
  PointerAnalysisOptions PStack_68;
  
  PointerAnalysisOptions::PointerAnalysisOptions(&PStack_68,&opts->super_PointerAnalysisOptions);
  pta::PointerAnalysisFS::PointerAnalysisFS(&this->super_PointerAnalysisFS,PS,&PStack_68);
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::~_Rb_tree(&PStack_68.super_AnalysisOptions.allocationFunctions._M_t);
  (this->super_PointerAnalysisFS).super_PointerAnalysis._vptr_PointerAnalysis =
       (_func_int **)&PTR__PointerAnalysisFS_001407f8;
  this->builder = b;
  return;
}

Assistant:

DGLLVMPointerAnalysisImpl(PointerGraph *PS, LLVMPointerGraphBuilder *b,
                              const LLVMPointerAnalysisOptions &opts)
            : PTType(PS, opts), builder(b) {}